

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpReader.cpp
# Opt level: O3

void __thiscall OpenMD::DumpReader::readFrameProperties(DumpReader *this,istream *inputStream)

{
  char *pcVar1;
  Snapshot *this_00;
  RealType RVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  long *plVar8;
  shared_ptr<OpenMD::SPFData> spfData;
  string line;
  string propertyName;
  StringTokenizer tokenizer;
  string local_118;
  RealType local_f8;
  RealType RStack_f0;
  RealType local_e8;
  RealType RStack_e0;
  RealType local_d8;
  string local_d0;
  char *local_b0;
  string local_a8;
  StringTokenizer local_88;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  Snapshot::clearDerivedProperties(this_00);
  pcVar1 = this->buffer;
  std::ios::widen((char)inputStream->_vptr_basic_istream[-3] + (char)inputStream);
  std::istream::getline((char *)inputStream,(long)pcVar1,'\0');
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  sVar6 = strlen(pcVar1);
  local_b0 = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,pcVar1,this->buffer + sVar6);
  lVar7 = std::__cxx11::string::find((char *)&local_d0,0x2598c8,0);
  if (lVar7 == -1) {
    builtin_strncpy(painCave.errMsg,"DumpReader Error: Missing <FrameData>\n",0x27);
    painCave.isFatal = 1;
    simError();
  }
  while( true ) {
    std::ios::widen((char)inputStream->_vptr_basic_istream[-3] + (char)inputStream);
    plVar8 = (long *)std::istream::getline((char *)inputStream,(long)local_b0,'\0');
    pcVar1 = local_b0;
    sVar3 = local_d0._M_string_length;
    if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0) break;
    strlen(local_b0);
    std::__cxx11::string::_M_replace((ulong)&local_d0,0,(char *)sVar3,(ulong)pcVar1);
    lVar7 = std::__cxx11::string::find((char *)&local_d0,0x2598fb,0);
    if (lVar7 != -1) break;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118," ;\t\n\r{}:,","");
    StringTokenizer::StringTokenizer(&local_88,&local_d0,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    bVar4 = StringTokenizer::hasMoreTokens(&local_88);
    if (!bVar4) {
      snprintf(painCave.errMsg,2000,"DumpReader Error: Not enough Tokens.\n%s\n",
               local_d0._M_dataplus._M_p);
      painCave.isFatal = 1;
      simError();
    }
    StringTokenizer::nextToken_abi_cxx11_(&local_a8,&local_88);
    iVar5 = std::__cxx11::string::compare((char *)&local_a8);
    if (iVar5 == 0) {
      RVar2 = StringTokenizer::nextTokenAsDouble(&local_88);
      Snapshot::setTime(this_00,RVar2);
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)&local_a8);
      if (iVar5 == 0) {
        local_e8 = 0.0;
        RStack_e0 = 0.0;
        local_f8 = 0.0;
        RStack_f0 = 0.0;
        local_118.field_2._M_allocated_capacity = 0;
        local_118.field_2._8_8_ = 0;
        local_118._M_dataplus._M_p = (pointer)0x0;
        local_118._M_string_length = 0;
        local_d8 = 0.0;
        local_118._M_dataplus._M_p = (pointer)StringTokenizer::nextTokenAsDouble(&local_88);
        local_118._M_string_length = (size_type)StringTokenizer::nextTokenAsDouble(&local_88);
        local_118.field_2._M_allocated_capacity =
             (size_type)StringTokenizer::nextTokenAsDouble(&local_88);
        local_118.field_2._8_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
        local_f8 = StringTokenizer::nextTokenAsDouble(&local_88);
        RStack_f0 = StringTokenizer::nextTokenAsDouble(&local_88);
        local_e8 = StringTokenizer::nextTokenAsDouble(&local_88);
        RStack_e0 = StringTokenizer::nextTokenAsDouble(&local_88);
        local_d8 = StringTokenizer::nextTokenAsDouble(&local_88);
        Snapshot::setHmat(this_00,(Mat3x3d *)&local_118);
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&local_a8);
        if (iVar5 == 0) {
          local_118._M_dataplus._M_p = (pointer)0x0;
          local_118._M_string_length = 0;
          local_118._M_dataplus._M_p = (pointer)StringTokenizer::nextTokenAsDouble(&local_88);
          local_118._M_string_length = (size_type)StringTokenizer::nextTokenAsDouble(&local_88);
          Snapshot::setThermostat(this_00,(pair<double,_double> *)&local_118);
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)&local_a8);
          if (iVar5 == 0) {
            local_e8 = 0.0;
            RStack_e0 = 0.0;
            local_f8 = 0.0;
            RStack_f0 = 0.0;
            local_118.field_2._M_allocated_capacity = 0;
            local_118.field_2._8_8_ = 0;
            local_118._M_dataplus._M_p = (pointer)0x0;
            local_118._M_string_length = 0;
            local_d8 = 0.0;
            local_118._M_dataplus._M_p = (pointer)StringTokenizer::nextTokenAsDouble(&local_88);
            local_118._M_string_length = (size_type)StringTokenizer::nextTokenAsDouble(&local_88);
            local_118.field_2._M_allocated_capacity =
                 (size_type)StringTokenizer::nextTokenAsDouble(&local_88);
            local_118.field_2._8_8_ = StringTokenizer::nextTokenAsDouble(&local_88);
            local_f8 = StringTokenizer::nextTokenAsDouble(&local_88);
            RStack_f0 = StringTokenizer::nextTokenAsDouble(&local_88);
            local_e8 = StringTokenizer::nextTokenAsDouble(&local_88);
            RStack_e0 = StringTokenizer::nextTokenAsDouble(&local_88);
            local_d8 = StringTokenizer::nextTokenAsDouble(&local_88);
            Snapshot::setBarostat(this_00,(Mat3x3d *)&local_118);
          }
          else {
            iVar5 = std::__cxx11::string::compare((char *)&local_a8);
            if (iVar5 == 0) {
              Snapshot::getSPFData(this_00);
              RVar2 = StringTokenizer::nextTokenAsDouble(&local_88);
              *(RealType *)local_118._M_dataplus._M_p = RVar2;
              RVar2 = StringTokenizer::nextTokenAsDouble(&local_88);
              *(RealType *)(local_118._M_dataplus._M_p + 8) = RVar2;
              RVar2 = StringTokenizer::nextTokenAsDouble(&local_88);
              *(RealType *)(local_118._M_dataplus._M_p + 0x10) = RVar2;
              RVar2 = StringTokenizer::nextTokenAsDouble(&local_88);
              *(RealType *)(local_118._M_dataplus._M_p + 0x18) = RVar2;
              iVar5 = StringTokenizer::nextTokenAsInt(&local_88);
              *(int *)(local_118._M_dataplus._M_p + 0x20) = iVar5;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_118._M_string_length);
              }
            }
            else {
              snprintf(painCave.errMsg,2000,
                       "DumpReader Error: %s is an invalid property in <FrameData>\n",
                       local_a8._M_dataplus._M_p);
              painCave.isFatal = 0;
              simError();
            }
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.delim_._M_dataplus._M_p != &local_88.delim_.field_2) {
      operator_delete(local_88.delim_._M_dataplus._M_p,
                      local_88.delim_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.tokenString_._M_dataplus._M_p != &local_88.tokenString_.field_2) {
      operator_delete(local_88.tokenString_._M_dataplus._M_p,
                      local_88.tokenString_.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void DumpReader::readFrameProperties(std::istream& inputStream) {
    Snapshot* s = info_->getSnapshotManager()->getCurrentSnapshot();
    // We're about to overwrite all frame properties, so clear out any
    // derived properties from previous use:
    s->clearDerivedProperties();

    inputStream.getline(buffer, bufferSize);
    std::string line(buffer);

    if (line.find("<FrameData>") == std::string::npos) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DumpReader Error: Missing <FrameData>\n");
      painCave.isFatal = 1;
      simError();
    }

    while (inputStream.getline(buffer, bufferSize)) {
      line = buffer;

      if (line.find("</FrameData>") != std::string::npos) { break; }

      StringTokenizer tokenizer(line, " ;\t\n\r{}:,");
      if (!tokenizer.hasMoreTokens()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "DumpReader Error: Not enough Tokens.\n%s\n", line.c_str());
        painCave.isFatal = 1;
        simError();
      }

      std::string propertyName = tokenizer.nextToken();
      if (propertyName == "Time") {
        RealType currTime = tokenizer.nextTokenAsDouble();
        s->setTime(currTime);
      } else if (propertyName == "Hmat") {
        Mat3x3d hmat;
        hmat(0, 0) = tokenizer.nextTokenAsDouble();
        hmat(0, 1) = tokenizer.nextTokenAsDouble();
        hmat(0, 2) = tokenizer.nextTokenAsDouble();
        hmat(1, 0) = tokenizer.nextTokenAsDouble();
        hmat(1, 1) = tokenizer.nextTokenAsDouble();
        hmat(1, 2) = tokenizer.nextTokenAsDouble();
        hmat(2, 0) = tokenizer.nextTokenAsDouble();
        hmat(2, 1) = tokenizer.nextTokenAsDouble();
        hmat(2, 2) = tokenizer.nextTokenAsDouble();
        s->setHmat(hmat);
      } else if (propertyName == "Thermostat") {
        pair<RealType, RealType> thermostat;
        thermostat.first  = tokenizer.nextTokenAsDouble();
        thermostat.second = tokenizer.nextTokenAsDouble();
        s->setThermostat(thermostat);
      } else if (propertyName == "Barostat") {
        Mat3x3d eta;
        eta(0, 0) = tokenizer.nextTokenAsDouble();
        eta(0, 1) = tokenizer.nextTokenAsDouble();
        eta(0, 2) = tokenizer.nextTokenAsDouble();
        eta(1, 0) = tokenizer.nextTokenAsDouble();
        eta(1, 1) = tokenizer.nextTokenAsDouble();
        eta(1, 2) = tokenizer.nextTokenAsDouble();
        eta(2, 0) = tokenizer.nextTokenAsDouble();
        eta(2, 1) = tokenizer.nextTokenAsDouble();
        eta(2, 2) = tokenizer.nextTokenAsDouble();
        s->setBarostat(eta);
      } else if (propertyName == "SPFData") {
        std::shared_ptr<SPFData> spfData = s->getSPFData();

        spfData->pos[0]   = tokenizer.nextTokenAsDouble();
        spfData->pos[1]   = tokenizer.nextTokenAsDouble();
        spfData->pos[2]   = tokenizer.nextTokenAsDouble();
        spfData->lambda   = tokenizer.nextTokenAsDouble();
        spfData->globalID = tokenizer.nextTokenAsInt();
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "DumpReader Error: %s is an invalid property in <FrameData>\n",
                 propertyName.c_str());
        painCave.isFatal = 0;
        simError();
      }
    }
  }